

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void get_min_from_loc(Am_Object *ref_obj,Am_Inter_Location *loc,int *min_left,int *min_top)

{
  bool bVar1;
  bool as_line;
  Am_Object loc_ref;
  int d;
  int c;
  int b;
  int a;
  bool local_31;
  Am_Object local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_30.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location(loc,&local_31,&local_30,&local_1c,&local_20,&local_24,&local_28);
  bVar1 = Am_Object::operator!=(&local_30,ref_obj);
  if (bVar1) {
    Am_Translate_Coordinates(&local_30,local_1c,local_20,ref_obj,&local_1c,&local_20);
  }
  if (local_1c < *min_left) {
    *min_left = local_1c;
  }
  if (local_20 < *min_top) {
    *min_top = local_20;
  }
  if (local_31 == true) {
    bVar1 = Am_Object::operator!=(&local_30,ref_obj);
    if (bVar1) {
      Am_Translate_Coordinates(&local_30,local_24,local_28,ref_obj,&local_24,&local_28);
    }
    if (local_24 < *min_left) {
      *min_left = local_24;
    }
    if (local_28 < *min_top) {
      *min_top = local_28;
    }
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
get_min_from_loc(Am_Object &ref_obj, Am_Inter_Location &loc, int &min_left,
                 int &min_top)
{
  int a, b, c, d;
  bool as_line;
  Am_Object loc_ref;
  loc.Get_Location(as_line, loc_ref, a, b, c, d);
  if (loc_ref != ref_obj)
    Am_Translate_Coordinates(loc_ref, a, b, ref_obj, a, b);
  if (a < min_left)
    min_left = a;
  if (b < min_top)
    min_top = b;
  if (as_line) {
    if (loc_ref != ref_obj)
      Am_Translate_Coordinates(loc_ref, c, d, ref_obj, c, d);
    if (c < min_left)
      min_left = c;
    if (d < min_top)
      min_top = d;
  }
}